

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ConvolutionLayerParams::SerializeWithCachedSizes
          (ConvolutionLayerParams *this,CodedOutputStream *output)

{
  bool bVar1;
  int iVar2;
  uint64 uVar3;
  int local_38;
  int n_3;
  int i_3;
  int n_2;
  int i_2;
  int n_1;
  int i_1;
  int n;
  int i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  ConvolutionLayerParams *this_local;
  
  uVar3 = outputchannels(this);
  if (uVar3 != 0) {
    uVar3 = outputchannels(this);
    google::protobuf::internal::WireFormatLite::WriteUInt64(1,uVar3,output);
  }
  uVar3 = kernelchannels(this);
  if (uVar3 != 0) {
    uVar3 = kernelchannels(this);
    google::protobuf::internal::WireFormatLite::WriteUInt64(2,uVar3,output);
  }
  uVar3 = ngroups(this);
  if (uVar3 != 0) {
    uVar3 = ngroups(this);
    google::protobuf::internal::WireFormatLite::WriteUInt64(10,uVar3,output);
  }
  iVar2 = kernelsize_size(this);
  if (0 < iVar2) {
    google::protobuf::internal::WireFormatLite::WriteTag(0x14,WIRETYPE_LENGTH_DELIMITED,output);
    google::protobuf::io::CodedOutputStream::WriteVarint32
              (output,this->_kernelsize_cached_byte_size_);
  }
  i_1 = 0;
  iVar2 = kernelsize_size(this);
  for (; i_1 < iVar2; i_1 = i_1 + 1) {
    uVar3 = kernelsize(this,i_1);
    google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(uVar3,output);
  }
  iVar2 = stride_size(this);
  if (0 < iVar2) {
    google::protobuf::internal::WireFormatLite::WriteTag(0x1e,WIRETYPE_LENGTH_DELIMITED,output);
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,this->_stride_cached_byte_size_);
  }
  i_2 = 0;
  iVar2 = stride_size(this);
  for (; i_2 < iVar2; i_2 = i_2 + 1) {
    uVar3 = stride(this,i_2);
    google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(uVar3,output);
  }
  iVar2 = dilationfactor_size(this);
  if (0 < iVar2) {
    google::protobuf::internal::WireFormatLite::WriteTag(0x28,WIRETYPE_LENGTH_DELIMITED,output);
    google::protobuf::io::CodedOutputStream::WriteVarint32
              (output,this->_dilationfactor_cached_byte_size_);
  }
  i_3 = 0;
  iVar2 = dilationfactor_size(this);
  for (; i_3 < iVar2; i_3 = i_3 + 1) {
    uVar3 = dilationfactor(this,i_3);
    google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(uVar3,output);
  }
  bVar1 = has_valid(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x32,&((this->ConvolutionPaddingType_).valid_)->super_MessageLite,output);
  }
  bVar1 = has_same(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x33,&((this->ConvolutionPaddingType_).valid_)->super_MessageLite,output);
  }
  bVar1 = isdeconvolution(this);
  if (bVar1) {
    bVar1 = isdeconvolution(this);
    google::protobuf::internal::WireFormatLite::WriteBool(0x3c,bVar1,output);
  }
  bVar1 = hasbias(this);
  if (bVar1) {
    bVar1 = hasbias(this);
    google::protobuf::internal::WireFormatLite::WriteBool(0x46,bVar1,output);
  }
  bVar1 = has_weights(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x5a,&this->weights_->super_MessageLite,output);
  }
  bVar1 = has_bias(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x5b,&this->bias_->super_MessageLite,output);
  }
  iVar2 = outputshape_size(this);
  if (0 < iVar2) {
    google::protobuf::internal::WireFormatLite::WriteTag(100,WIRETYPE_LENGTH_DELIMITED,output);
    google::protobuf::io::CodedOutputStream::WriteVarint32
              (output,this->_outputshape_cached_byte_size_);
  }
  local_38 = 0;
  iVar2 = outputshape_size(this);
  for (; local_38 < iVar2; local_38 = local_38 + 1) {
    uVar3 = outputshape(this,local_38);
    google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(uVar3,output);
  }
  return;
}

Assistant:

void ConvolutionLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.ConvolutionLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // uint64 outputChannels = 1;
  if (this->outputchannels() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(1, this->outputchannels(), output);
  }

  // uint64 kernelChannels = 2;
  if (this->kernelchannels() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(2, this->kernelchannels(), output);
  }

  // uint64 nGroups = 10;
  if (this->ngroups() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(10, this->ngroups(), output);
  }

  // repeated uint64 kernelSize = 20;
  if (this->kernelsize_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(20, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_kernelsize_cached_byte_size_);
  }
  for (int i = 0, n = this->kernelsize_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(
      this->kernelsize(i), output);
  }

  // repeated uint64 stride = 30;
  if (this->stride_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(30, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_stride_cached_byte_size_);
  }
  for (int i = 0, n = this->stride_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(
      this->stride(i), output);
  }

  // repeated uint64 dilationFactor = 40;
  if (this->dilationfactor_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(40, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_dilationfactor_cached_byte_size_);
  }
  for (int i = 0, n = this->dilationfactor_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(
      this->dilationfactor(i), output);
  }

  // .CoreML.Specification.ValidPadding valid = 50;
  if (has_valid()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      50, *ConvolutionPaddingType_.valid_, output);
  }

  // .CoreML.Specification.SamePadding same = 51;
  if (has_same()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      51, *ConvolutionPaddingType_.same_, output);
  }

  // bool isDeconvolution = 60;
  if (this->isdeconvolution() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(60, this->isdeconvolution(), output);
  }

  // bool hasBias = 70;
  if (this->hasbias() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(70, this->hasbias(), output);
  }

  // .CoreML.Specification.WeightParams weights = 90;
  if (this->has_weights()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      90, *this->weights_, output);
  }

  // .CoreML.Specification.WeightParams bias = 91;
  if (this->has_bias()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      91, *this->bias_, output);
  }

  // repeated uint64 outputShape = 100;
  if (this->outputshape_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(100, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_outputshape_cached_byte_size_);
  }
  for (int i = 0, n = this->outputshape_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(
      this->outputshape(i), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.ConvolutionLayerParams)
}